

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# realdata_unit.c
# Opt level: O0

_Bool compare_negations(roaring_bitmap_t **rnorun,roaring_bitmap_t **rruns,size_t count)

{
  _Bool _Var1;
  ulong in_RDX;
  size_t i;
  roaring_bitmap_t *in_stack_00000030;
  ulong local_28;
  
  local_28 = 0;
  while( true ) {
    if (in_RDX <= local_28) {
      return true;
    }
    _Var1 = is_negation_correct(in_stack_00000030);
    if (!_Var1) break;
    _Var1 = is_negation_correct(in_stack_00000030);
    if (!_Var1) {
      printf("runs negations incorrect\n");
      return false;
    }
    local_28 = local_28 + 1;
  }
  printf("no-run negation incorrect\n");
  return false;
}

Assistant:

bool compare_negations(roaring_bitmap_t **rnorun, roaring_bitmap_t **rruns,
                       size_t count) {
    for (size_t i = 0; i < count; ++i) {
        if (!is_negation_correct(rnorun[i])) {
            printf("no-run negation incorrect\n");
            return false;
        }
        if (!is_negation_correct(rruns[i])) {
            printf("runs negations incorrect\n");
            return false;
        }
    }
    return true;
}